

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatictext.cpp
# Opt level: O2

void __thiscall QStaticText::prepare(QStaticText *this,QTransform *matrix,QFont *font)

{
  long lVar1;
  QTransform *pQVar2;
  
  pQVar2 = &((this->data).d.ptr)->matrix;
  for (lVar1 = 0x4a; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined1 *)pQVar2->m_matrix[0] = *(undefined1 *)matrix->m_matrix[0];
    matrix = (QTransform *)((long)matrix->m_matrix[0] + 1);
    pQVar2 = (QTransform *)((long)pQVar2->m_matrix[0] + 1);
  }
  QFont::operator=(&((this->data).d.ptr)->font,font);
  QStaticTextPrivate::init((this->data).d.ptr,(EVP_PKEY_CTX *)font);
  return;
}

Assistant:

void QStaticText::prepare(const QTransform &matrix, const QFont &font)
{
    data->matrix = matrix;
    data->font = font;
    data->init();
}